

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

int __thiscall
QTextDocumentPrivate::remove_block
          (QTextDocumentPrivate *this,int pos,int *blockFormat,int command,Operation op)

{
  BlockMap *this_00;
  long lVar1;
  long *plVar2;
  uint uVar3;
  uint z;
  uint f;
  QTextBlockData *pQVar4;
  QObject *pQVar5;
  QTextBlockGroup *pQVar6;
  QTextFrame *pQVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->blocks;
  uVar3 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  uVar8 = (ulong)uVar3;
  if ((command != 6) ||
     (pQVar4 = (this->blocks).data.field_0.fragments, uVar9 = uVar8, f = uVar3,
     pQVar4[uVar8].super_QFragment<3>.size_array[0] != 1)) {
    f = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar3);
    pQVar4 = (this_00->data).field_0.fragments;
    uVar9 = (ulong)f;
    QFragmentMap<QTextBlockData>::setSize
              (this_00,uVar3,
               pQVar4[uVar8].super_QFragment<3>.size_array[0] +
               pQVar4[uVar9].super_QFragment<3>.size_array[0] + -1,0);
    pQVar4 = (this_00->data).field_0.fragments;
    pQVar4[uVar8].userState = pQVar4[uVar9].userState;
    pQVar4 = (QTextBlockData *)(this_00->data).field_0.head;
  }
  *blockFormat = pQVar4[uVar9].format;
  pQVar5 = &objectForFormat(this,(this->blocks).data.field_0.fragments[uVar9].format)->super_QObject
  ;
  pQVar6 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar5);
  if (pQVar6 != (QTextBlockGroup *)0x0) {
    (**(code **)(*(long *)&pQVar6->super_QTextObject + 0x68))(pQVar6);
  }
  pQVar5 = &objectForFormat(this,(this->fragments).data.field_0.fragments[z].format)->super_QObject;
  pQVar7 = QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(pQVar5);
  if (pQVar7 != (QTextFrame *)0x0) {
    plVar2 = *(long **)&(pQVar7->super_QTextObject).field_0x8;
    (**(code **)(*plVar2 + 0x28))
              (plVar2,(this->text).d.ptr[(this->fragments).data.field_0.fragments[z].stringPosition]
               ,z);
    this->framesDirty = true;
  }
  QFragmentMap<QTextBlockData>::erase_single(this_00,f);
  uVar3 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  adjustDocumentChangesAndCursors(this,pos,-1,op);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::remove_block(int pos, int *blockFormat, int command, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(blocks.length() > pos);

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(x && (int)fragments.position(x) == pos);
    Q_ASSERT(fragments.size(x) == 1);
    Q_ASSERT(isValidBlockSeparator(text.at(fragments.fragment(x)->stringPosition)));
    Q_ASSERT(b);

    if (blocks.size(b) == 1 && command == QTextUndoCommand::BlockAdded) {
        Q_ASSERT((int)blocks.position(b) == pos);
        // qDebug("removing empty block");
        // empty block remove the block itself
    } else {
        // non empty block, merge with next one into this block
        // qDebug("merging block with next");
        int n = blocks.next(b);
        Q_ASSERT((int)blocks.position(n) == pos + 1);
        blocks.setSize(b, blocks.size(b) + blocks.size(n) - 1);
        blocks.fragment(b)->userState = blocks.fragment(n)->userState;
        b = n;
    }
    *blockFormat = blocks.fragment(b)->format;

    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(blocks.fragment(b)->format));
    if (group)
        group->blockRemoved(QTextBlock(this, b));

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    blocks.erase_single(b);
    const int w = fragments.erase_single(x);

    adjustDocumentChangesAndCursors(pos, -1, op);

    return w;
}